

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScanTargetGLSLFragments.cpp
# Opt level: O1

string * __thiscall
Outputs::Display::OpenGL::ScanTarget::sampling_function_abi_cxx11_
          (string *__return_storage_ptr__,ScanTarget *this)

{
  InputDataType IVar1;
  Modals *pMVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pMVar2 = BufferingScanTarget::modals(&this->super_BufferingScanTarget);
  IVar1 = pMVar2->input_data_type;
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  switch(IVar1) {
  case Luminance1:
  case Luminance8:
    break;
  case PhaseLinkedLuminance8:
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case Luminance8Phase8:
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case Red1Green1Blue1:
  case Red2Green2Blue2:
  case Red4Green4Blue4:
  case Red8Green8Blue8:
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  default:
    goto switchD_003dcbb1_default;
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
switchD_003dcbb1_default:
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ScanTarget::sampling_function() const {
	std::string fragment_shader;
	const auto modals = BufferingScanTarget::modals();
	const bool is_svideo = modals.display_type == DisplayType::SVideo;

	if(is_svideo) {
		fragment_shader +=
			"vec2 svideo_sample(vec2 coordinate, float angle) {";
	} else {
		fragment_shader +=
			"float composite_sample(vec2 coordinate, float angle) {";
	}

	switch(modals.input_data_type) {
		case InputDataType::Luminance1:
		case InputDataType::Luminance8:
			// Easy, just copy across.
			fragment_shader +=
				is_svideo ?
					"return vec2(textureLod(textureName, coordinate, 0).r, 0.0);" :
					"return textureLod(textureName, coordinate, 0).r;";
		break;

		case InputDataType::PhaseLinkedLuminance8:
			fragment_shader +=
				"uint iPhase = uint(step(sign(angle), 0.0) * 3) ^ uint(abs(angle * 2.0 / 3.141592654) ) & 3u;";

			fragment_shader +=
				is_svideo ?
					"return vec2(textureLod(textureName, coordinate, 0)[iPhase], 0.0);" :
					"return textureLod(textureName, coordinate, 0)[iPhase];";
		break;

		case InputDataType::Luminance8Phase8:
			fragment_shader +=
				"vec2 yc = textureLod(textureName, coordinate, 0).rg;"

				"float phaseOffset = 3.141592654 * 2.0 * 2.0 * yc.y;"
				"float rawChroma = step(yc.y, 0.75) * cos(angle + phaseOffset);";

			fragment_shader +=
				is_svideo ?
					"return vec2(yc.x, rawChroma);" :
					"return mix(yc.x, rawChroma, compositeAmplitude);";
		break;

		case InputDataType::Red1Green1Blue1:
		case InputDataType::Red2Green2Blue2:
		case InputDataType::Red4Green4Blue4:
		case InputDataType::Red8Green8Blue8:
			fragment_shader +=
				"vec3 colour = rgbToLumaChroma * textureLod(textureName, coordinate, 0).rgb;"
				"vec2 quadrature = vec2(cos(angle), sin(angle));";

			fragment_shader +=
				is_svideo ?
					"return vec2(colour.r, dot(quadrature, colour.gb));" :
					"return mix(colour.r, dot(quadrature, colour.gb), compositeAmplitude);";
		break;
	}

	fragment_shader += "}";

	return fragment_shader;
}